

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

int Au_NtkNodeNumFunc(Au_Ntk_t *p,int Func)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (((p->pMan == (Au_Man_t *)0x0) || (p->pMan->pFuncs == (Abc_Nam_t *)0x0)) &&
     (lVar4 = (long)(p->vObjs).nSize, 0 < lVar4)) {
    lVar5 = 0;
    iVar3 = 0;
    do {
      uVar1 = (p->vObjs).pArray[lVar5];
      uVar2 = *(ulong *)((long)(p->vPages).pArray[(int)uVar1 >> 0xc] + (ulong)((uVar1 & 0xfff) << 4)
                        );
      iVar3 = iVar3 + (uint)(((uint)uVar2 & 0x3fffffff) == Func && (~uVar2 & 0x700000000) == 0);
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
    return iVar3;
  }
  return 0;
}

Assistant:

int Au_NtkNodeNumFunc( Au_Ntk_t * p, int Func )
{
    Au_Obj_t * pObj;
    int i, Counter = 0;
    if ( p->pMan && p->pMan->pFuncs )
        return 0;
    Au_NtkForEachNode( p, pObj, i )
    {
        Counter += (pObj->Func == (unsigned)Func);
//        printf( "%d ", pObj->Func );
    }
//    printf( "\n" );
    return Counter;
}